

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dlerror.c
# Opt level: O2

int run_test_dlerror(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uStackY_40;
  char *pcVar5;
  uv_lib_t local_18;
  
  local_18.handle = (void *)0x0;
  local_18.errmsg = (char *)0x0;
  pcVar2 = uv_dlerror(&local_18);
  if (pcVar2 == (char *)0x0) {
    pcVar4 = "!=";
    pcVar5 = "!=";
    pcVar2 = (char *)0x0;
    pcVar3 = "msg";
    uStackY_40 = 0x25;
  }
  else {
    pcVar2 = strstr(pcVar2,"no error");
    if (pcVar2 == (char *)0x0) {
      pcVar4 = "!=";
      pcVar5 = "!=";
      pcVar2 = (char *)0x0;
      pcVar3 = "strstr(msg, dlerror_no_error)";
      uStackY_40 = 0x26;
    }
    else {
      iVar1 = uv_dlopen("test/fixtures/load_error.node",&local_18);
      if (iVar1 != -1) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
                ,0x29,"r == -1");
        abort();
      }
      pcVar2 = uv_dlerror(&local_18);
      if (pcVar2 == (char *)0x0) {
        pcVar4 = "!=";
        pcVar5 = "!=";
        pcVar2 = (char *)0x0;
        pcVar3 = "msg";
        uStackY_40 = 0x2c;
      }
      else {
        pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
        if (pcVar3 == (char *)0x0) {
          pcVar4 = "!=";
          pcVar5 = "!=";
          pcVar2 = (char *)0x0;
          pcVar3 = "strstr(msg, path)";
          uStackY_40 = 0x2e;
        }
        else {
          pcVar2 = strstr(pcVar2,"no error");
          if (pcVar2 == (char *)0x0) {
            pcVar2 = uv_dlerror(&local_18);
            if (pcVar2 == (char *)0x0) {
              pcVar4 = "!=";
              pcVar5 = "!=";
              pcVar2 = (char *)0x0;
              pcVar3 = "msg";
              uStackY_40 = 0x34;
            }
            else {
              pcVar3 = strstr(pcVar2,"test/fixtures/load_error.node");
              if (pcVar3 == (char *)0x0) {
                pcVar4 = "!=";
                pcVar5 = "!=";
                pcVar2 = (char *)0x0;
                pcVar3 = "strstr(msg, path)";
                uStackY_40 = 0x36;
              }
              else {
                pcVar2 = strstr(pcVar2,"no error");
                if (pcVar2 == (char *)0x0) {
                  uv_dlclose(&local_18);
                  return 0;
                }
                pcVar4 = "==";
                pcVar5 = "==";
                pcVar3 = "strstr(msg, dlerror_no_error)";
                uStackY_40 = 0x38;
              }
            }
          }
          else {
            pcVar4 = "==";
            pcVar5 = "==";
            pcVar3 = "strstr(msg, dlerror_no_error)";
            uStackY_40 = 0x30;
          }
        }
      }
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-dlerror.c"
          ,uStackY_40,pcVar3,pcVar4,"NULL",pcVar2,pcVar5,0);
  abort();
}

Assistant:

TEST_IMPL(dlerror) {
  const char* path = "test/fixtures/load_error.node";
  const char* dlerror_no_error = "no error";
  const char* msg;
  uv_lib_t lib;
  int r;

  lib.errmsg = NULL;
  lib.handle = NULL;
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
  ASSERT_NOT_NULL(strstr(msg, dlerror_no_error));

  r = uv_dlopen(path, &lib);
  ASSERT(r == -1);

  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  /* Should return the same error twice in a row. */
  msg = uv_dlerror(&lib);
  ASSERT_NOT_NULL(msg);
#if !defined(__OpenBSD__) && !defined(__QNX__)
  ASSERT_NOT_NULL(strstr(msg, path));
#endif
  ASSERT_NULL(strstr(msg, dlerror_no_error));

  uv_dlclose(&lib);

  return 0;
}